

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorbase.h
# Opt level: O1

VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::operator-(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *__return_storage_ptr__,
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *vec)

{
  pointer pnVar1;
  cpp_dec_float<200U,_int,_void> *v;
  long lVar2;
  long lVar3;
  cpp_dec_float<200U,_int,_void> *v_00;
  cpp_dec_float<200U,_int,_void> *pcVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar7 = 0;
  (__return_storage_ptr__->val).
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->val).
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->val).
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::reserve(&__return_storage_ptr__->val,
            (long)(int)((ulong)((long)(this->val).
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->val).
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 7));
  uVar5 = (uint)((ulong)((long)(this->val).
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 7);
  if (0 < (int)uVar5) {
    uVar6 = (ulong)(uVar5 & 0x7fffffff);
    lVar3 = 0;
    do {
      pnVar1 = (this->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      v_00 = (cpp_dec_float<200U,_int,_void> *)((long)&(pnVar1->m_backend).data + lVar3);
      v = (cpp_dec_float<200U,_int,_void> *)
          ((long)&(((vec->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar3);
      local_b8.fpclass = cpp_dec_float_finite;
      local_b8.prec_elem = 0x1c;
      local_b8.data._M_elems[0] = 0;
      local_b8.data._M_elems[1] = 0;
      local_b8.data._M_elems[2] = 0;
      local_b8.data._M_elems[3] = 0;
      local_b8.data._M_elems[4] = 0;
      local_b8.data._M_elems[5] = 0;
      local_b8.data._M_elems[6] = 0;
      local_b8.data._M_elems[7] = 0;
      local_b8.data._M_elems[8] = 0;
      local_b8.data._M_elems[9] = 0;
      local_b8.data._M_elems[10] = 0;
      local_b8.data._M_elems[0xb] = 0;
      local_b8.data._M_elems[0xc] = 0;
      local_b8.data._M_elems[0xd] = 0;
      local_b8.data._M_elems[0xe] = 0;
      local_b8.data._M_elems[0xf] = 0;
      local_b8.data._M_elems[0x10] = 0;
      local_b8.data._M_elems[0x11] = 0;
      local_b8.data._M_elems[0x12] = 0;
      local_b8.data._M_elems[0x13] = 0;
      local_b8.data._M_elems[0x14] = 0;
      local_b8.data._M_elems[0x15] = 0;
      local_b8.data._M_elems[0x16] = 0;
      local_b8.data._M_elems[0x17] = 0;
      local_b8.data._M_elems[0x18] = 0;
      local_b8.data._M_elems[0x19] = 0;
      local_b8.data._M_elems._104_5_ = 0;
      local_b8.data._M_elems[0x1b]._1_3_ = 0;
      local_b8.exp = 0;
      local_b8.neg = false;
      if (v == &local_b8) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=(&local_b8,v_00);
        if (local_b8.data._M_elems[0] != 0 || local_b8.fpclass != cpp_dec_float_finite) {
          local_b8.neg = (bool)(local_b8.neg ^ 1);
        }
      }
      else {
        if (v_00 != &local_b8) {
          pcVar4 = &local_b8;
          for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
            *(uint *)pcVar4 = (v_00->data)._M_elems[0];
            v_00 = (cpp_dec_float<200U,_int,_void> *)((long)v_00 + (ulong)bVar7 * -8 + 4);
            pcVar4 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar4 + ((ulong)bVar7 * -2 + 1) * 4);
          }
          local_b8.exp = *(int *)((long)&(pnVar1->m_backend).data + lVar3 + 0x70);
          local_b8.neg = *(bool *)((long)&(pnVar1->m_backend).data + lVar3 + 0x74);
          local_b8._120_8_ = *(undefined8 *)((long)&(pnVar1->m_backend).data + lVar3 + 0x78);
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=(&local_b8,v);
      }
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>>
      ::
      emplace_back<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>>
                  *)__return_storage_ptr__,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_b8);
      lVar3 = lVar3 + 0x80;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

const VectorBase<R> operator-(const VectorBase<R>& vec) const
   {
      assert(vec.dim() == dim());
      VectorBase<R> res;
      res.val.reserve(dim());

      auto dimen = dim();

      for(decltype(dimen) i = 0; i < dimen; i++)
      {
         res.val.push_back(val[i] - vec[i]);
      }

      return res;
   }